

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O1

void __thiscall
SEIUnit::serialize_buffering_period_message
          (SEIUnit *this,SPSUnit *sps,BitStreamWriter *writer,bool seiHeader)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint *puVar5;
  int iVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  
  if ((int)CONCAT71(in_register_00000009,seiHeader) != 0) {
    BitStreamWriter::putBits(writer,8,6);
    BitStreamWriter::putBits(writer,8,0);
  }
  puVar5 = (writer->super_BitStream).m_initBuffer;
  iVar6 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar5;
  iVar1 = writer->m_bitWrited + iVar6 * 8;
  iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  BitStreamWriter::putBits(writer,8,0);
  uVar2 = *(undefined4 *)&(writer->super_BitStream).m_initBuffer;
  uVar3 = writer->m_bitWrited;
  uVar4 = *(undefined4 *)&(writer->super_BitStream).m_buffer;
  NALUnit::writeUEGolombCode(writer,sps->seq_parameter_set_id);
  if ((sps->nalHrdParams).isPresent == true) {
    uVar7 = 0xffffffffffffffff;
    do {
      BitStreamWriter::putBits
                (writer,(sps->nalHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay[uVar7 + 1]);
      BitStreamWriter::putBits
                (writer,(sps->nalHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay_offset[uVar7 + 1]);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (sps->nalHrdParams).cpb_cnt_minus1);
  }
  if ((sps->vclHrdParams).isPresent == true) {
    uVar7 = 0xffffffffffffffff;
    do {
      BitStreamWriter::putBits
                (writer,(sps->vclHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay[uVar7 + 1]);
      BitStreamWriter::putBits
                (writer,(sps->vclHrdParams).initial_cpb_removal_delay_length_minus1 + 1,
                 this->initial_cpb_removal_delay_offset[uVar7 + 1]);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (sps->vclHrdParams).cpb_cnt_minus1);
  }
  NALUnit::write_byte_align_bits(writer);
  *(char *)((long)puVar5 + (long)(iVar6 >> 3)) =
       (char)(writer->m_bitWrited - uVar3 >> 3) +
       ((char)*(undefined4 *)&(writer->super_BitStream).m_buffer -
       (char)*(undefined4 *)&(writer->super_BitStream).m_initBuffer) + ((char)uVar2 - (char)uVar4);
  if (seiHeader) {
    NALUnit::write_rbsp_trailing_bits(writer);
    return;
  }
  return;
}

Assistant:

void SEIUnit::serialize_buffering_period_message(const SPSUnit& sps, BitStreamWriter& writer,
                                                 const bool seiHeader) const
{
    if (seiHeader)
    {
        writer.putBits(8, static_cast<int>(NALType::nuSEI));
        writer.putBits(8, SEI_MSG_BUFFERING_PERIOD);
    }
    uint8_t* size = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);
    const unsigned beforeMessageLen = writer.getBitsCount();

    // buffering period
    writeUEGolombCode(writer, sps.seq_parameter_set_id);
    if (sps.nalHrdParams.isPresent)
    {  // NalHrdBpPresentFlag
        for (size_t SchedSelIdx = 0; SchedSelIdx <= sps.nalHrdParams.cpb_cnt_minus1; SchedSelIdx++)
        {
            writer.putBits(sps.nalHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay[SchedSelIdx]);
            writer.putBits(sps.nalHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay_offset[SchedSelIdx]);
        }
    }
    if (sps.vclHrdParams.isPresent)
    {  // vclHrdBpPresentFlag
        for (size_t SchedSelIdx = 0; SchedSelIdx <= sps.vclHrdParams.cpb_cnt_minus1; SchedSelIdx++)
        {
            writer.putBits(sps.vclHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay[SchedSelIdx]);
            writer.putBits(sps.vclHrdParams.initial_cpb_removal_delay_length_minus1 + 1,
                           initial_cpb_removal_delay_offset[SchedSelIdx]);
        }
    }
    write_byte_align_bits(writer);
    // ---------
    const unsigned msgLen = writer.getBitsCount() - beforeMessageLen;
    *size = static_cast<uint8_t>(msgLen / 8);

    if (seiHeader)
        write_rbsp_trailing_bits(writer);
}